

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenTableGrowSetTable(BinaryenExpressionRef expr,char *table)

{
  IString *this;
  undefined1 in_CL;
  string_view sVar1;
  
  if (expr->_id != TableGrowId) {
    __assert_fail("expression->is<TableGrow>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xa00,"void BinaryenTableGrowSetTable(BinaryenExpressionRef, const char *)");
  }
  if (table != (char *)0x0) {
    this = (IString *)strlen(table);
    sVar1._M_str = (char *)0x0;
    sVar1._M_len = (size_t)table;
    sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
    *(string_view *)(expr + 1) = sVar1;
    return;
  }
  __assert_fail("table",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xa01,"void BinaryenTableGrowSetTable(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenTableGrowSetTable(BinaryenExpressionRef expr, const char* table) {
  auto* expression = (Expression*)expr;
  assert(expression->is<TableGrow>());
  assert(table);
  static_cast<TableGrow*>(expression)->table = table;
}